

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O1

UnitQuaternion * pureQuaternion(Vector3 *bodyFixedFrameVelocityInInertialFrame)

{
  double dVar1;
  UnitQuaternion *in_RDI;
  
  in_RDI->m_data[0] = 0.0;
  dVar1 = bodyFixedFrameVelocityInInertialFrame->m_data[1];
  in_RDI->m_data[1] = bodyFixedFrameVelocityInInertialFrame->m_data[0];
  in_RDI->m_data[2] = dVar1;
  in_RDI->m_data[3] = bodyFixedFrameVelocityInInertialFrame->m_data[2];
  return in_RDI;
}

Assistant:

iDynTree::UnitQuaternion pureQuaternion(const iDynTree::Vector3& bodyFixedFrameVelocityInInertialFrame)
{
    iDynTree::UnitQuaternion p;
    p(0) = 0;
    p(1) = bodyFixedFrameVelocityInInertialFrame(0);
    p(2) = bodyFixedFrameVelocityInInertialFrame(1);
    p(3) = bodyFixedFrameVelocityInInertialFrame(2);
    return p;
}